

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldsout.c
# Opt level: O3

uint sysout_loader(char *sysout_file_name,uint sys_size)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  __off_t _Var11;
  ssize_t sVar12;
  DLword *pDVar13;
  ulong uVar14;
  void *__buf;
  uint *puVar15;
  ulong extraout_RDX;
  long extraout_RDX_00;
  uint uVar16;
  char *__offset;
  uint uVar17;
  stat *psVar18;
  ushort *puVar19;
  ulong in_R8;
  uint uVar20;
  ulong in_R9;
  long lVar21;
  long lVar22;
  uint uVar23;
  void *pvVar24;
  ulong uVar25;
  char *unaff_R15;
  IFPAGE ifpage;
  stat stat_buf;
  uint local_200;
  uint uStack_1f8;
  undefined1 local_1e8 [18];
  ushort local_1d6;
  ushort local_1d2;
  ushort local_1cc;
  short local_18a;
  ushort local_174;
  uint local_144;
  uint local_13c;
  stat local_138;
  
  if (sys_size - 1 < 7) {
LAB_00129e9b:
    sysout_loader_cold_14();
LAB_00129ea0:
    sysout_file_name = unaff_R15;
    sysout_loader_cold_13();
LAB_00129ea5:
    sysout_loader_cold_12();
LAB_00129eb5:
    sysout_loader_cold_11();
LAB_00129eba:
    sysout_loader_cold_10();
LAB_00129ebf:
    sysout_loader_cold_9();
LAB_00129ec9:
    sysout_loader_cold_8();
LAB_00129ed3:
    sysout_loader_cold_7();
  }
  else {
    if (0x100 < sys_size) goto LAB_00129ea0;
    iVar8 = open(sysout_file_name,0);
    if (iVar8 == -1) goto LAB_00129ea5;
    _Var11 = lseek(iVar8,0x200,0);
    if (_Var11 == -1) goto LAB_00129eb5;
    sVar12 = read(iVar8,local_1e8,0xb0);
    if (sVar12 == -1) goto LAB_00129eba;
    word_swap_page(local_1e8,0x2c);
    if (local_1d6 < 0x88c2) goto LAB_00129ebf;
    if (0x88c2 < local_1d2) goto LAB_00129ec9;
    pvVar24 = (void *)(ulong)local_13c;
    uVar17 = 0x40;
    if (local_13c != 0) {
      uVar17 = local_13c;
    }
    if (sys_size != 0) {
      uVar17 = sys_size;
    }
    iVar9 = 1;
    if (((ushort)(local_18a - 3U) < 2) && (iVar9 = 0, local_13c != uVar17)) {
LAB_00129f39:
      puVar15 = &local_13c;
      psVar18 = &local_138;
      sysout_loader_cold_1();
      uVar17 = (uint)pvVar24;
      uVar23 = (uint)INVERT_atom;
      uVar25 = in_R9;
      if (uVar23 == local_200) {
        uVar25 = in_R8;
      }
      uVar10 = (uint)uVar25;
      bVar4 = (byte)in_R8;
      if (uVar23 == local_200) {
        bVar4 = (byte)in_R9;
      }
      if ((lineBlt8::beforecolor0 != bVar4) || (lineBlt8::beforecolor1 != (uchar)uVar25)) {
        uVar20 = (uVar10 & 0xff) * 0x1010101;
        uVar16 = (uint)bVar4 * 0x1010101;
        lVar21 = 0;
        lineBlt8::beforecolor0 = bVar4;
        lineBlt8::beforecolor1 = (uchar)uVar25;
        do {
          uVar5 = *(uint *)((long)ConvBM_tbl + lVar21 + 4);
          uVar6 = *(uint *)((long)ConvBM_tbl + lVar21 + 8);
          uVar7 = *(uint *)((long)ConvBM_tbl + lVar21 + 0xc);
          *(uint *)((long)lineBlt8::color_array + lVar21) =
               ~*(uint *)((long)ConvBM_tbl + lVar21) & uVar16 |
               *(uint *)((long)ConvBM_tbl + lVar21) & uVar20;
          *(uint *)((long)lineBlt8::color_array + lVar21 + 4) = ~uVar5 & uVar16 | uVar5 & uVar20;
          *(uint *)((long)lineBlt8::color_array + lVar21 + 8) = ~uVar6 & uVar16 | uVar6 & uVar20;
          *(uint *)((long)lineBlt8::color_array + lVar21 + 0xc) = ~uVar7 & uVar16 | uVar7 & uVar20;
          lVar21 = lVar21 + 0x10;
        } while (lVar21 != 0x40);
      }
      uVar16 = (uint)puVar15;
      if (REPLACE_atom == uStack_1f8) {
        uVar23 = uVar17 + 0xf;
        if (-1 < (int)uVar17) {
          uVar23 = uVar17;
        }
        puVar19 = (ushort *)((long)psVar18->__unused + (long)((int)uVar23 >> 4) * 2 + -0x78);
        lVar21 = extraout_RDX_00;
        if (3 < (int)uVar16) {
          do {
            uVar17 = (uint)pvVar24;
            uVar23 = uVar17 + 0xf;
            if (-1 < (int)uVar17) {
              uVar23 = uVar17;
            }
            switch(uVar17 - (uVar23 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 0xc) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 1:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 3:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 5:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 6:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 7:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 8:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 9:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 10:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xb:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x1e) * 2);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xc:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              puVar19 = puVar19 + 1;
              break;
            case 0xd:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xe:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xf:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(undefined1 *)(lVar21 + lVar22) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
            }
            iVar8 = (int)puVar15;
            uVar16 = iVar8 - 4;
            lVar21 = lVar21 + 4;
            uVar17 = uVar17 + 4;
            pvVar24 = (void *)(ulong)uVar17;
            puVar15 = (uint *)(ulong)uVar16;
          } while (7 < iVar8);
        }
        if (0xfffffffc < uVar16 - 4) {
          lVar22 = 0;
          uVar10 = uVar10 & 0xff;
          do {
            uVar20 = uVar17 + (int)lVar22;
            uVar23 = uVar17 + 0xf + (int)lVar22;
            if (-1 < (int)uVar20) {
              uVar23 = uVar20;
            }
            iVar8 = uVar20 - (uVar23 & 0xfffffff0);
            uVar23 = (uint)bVar4;
            if ((BitMaskArray[iVar8] & *puVar19) != 0) {
              uVar23 = uVar10;
            }
            *(char *)(lVar21 + lVar22) = (char)uVar23;
            puVar19 = puVar19 + (iVar8 == 0xf);
            lVar22 = lVar22 + 1;
          } while (uVar16 != (uint)lVar22);
        }
      }
      else if (uVar23 == uStack_1f8) {
        uVar23 = uVar17 + 0xf;
        if (-1 < (int)uVar17) {
          uVar23 = uVar17;
        }
        puVar19 = (ushort *)((long)psVar18->__unused + (long)((int)uVar23 >> 4) * 2 + -0x78);
        lVar21 = extraout_RDX_00;
        if (3 < (int)uVar16) {
          do {
            uVar17 = (uint)pvVar24;
            uVar23 = uVar17 + 0xf;
            if (-1 < (int)uVar17) {
              uVar23 = uVar17;
            }
            switch(uVar17 - (uVar23 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 0xc) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 1:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 3:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 5:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 6:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 7:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 8:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 9:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 10:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xb:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x1e) * 2);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xc:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              puVar19 = puVar19 + 1;
              break;
            case 0xd:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xe:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xf:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
            }
            iVar8 = (int)puVar15;
            uVar16 = iVar8 - 4;
            lVar21 = lVar21 + 4;
            uVar17 = uVar17 + 4;
            pvVar24 = (void *)(ulong)uVar17;
            puVar15 = (uint *)(ulong)uVar16;
          } while (7 < iVar8);
        }
        if (0xfffffffc < uVar16 - 4) {
          lVar22 = 0;
          uVar10 = uVar10 & 0xff;
          do {
            uVar20 = uVar17 + (int)lVar22;
            uVar23 = uVar17 + 0xf + (int)lVar22;
            if (-1 < (int)uVar20) {
              uVar23 = uVar20;
            }
            iVar8 = uVar20 - (uVar23 & 0xfffffff0);
            uVar23 = (uint)bVar4;
            if ((BitMaskArray[iVar8] & *puVar19) != 0) {
              uVar23 = uVar10;
            }
            *(byte *)(lVar21 + lVar22) = *(byte *)(lVar21 + lVar22) ^ (byte)uVar23;
            puVar19 = puVar19 + (iVar8 == 0xf);
            lVar22 = lVar22 + 1;
          } while (uVar16 != (uint)lVar22);
        }
      }
      else if (PAINT_atom == uStack_1f8) {
        uVar23 = uVar17 + 0xf;
        if (-1 < (int)uVar17) {
          uVar23 = uVar17;
        }
        puVar19 = (ushort *)((long)psVar18->__unused + (long)((int)uVar23 >> 4) * 2 + -0x78);
        lVar21 = extraout_RDX_00;
        if (3 < (int)uVar16) {
          do {
            uVar17 = (uint)pvVar24;
            uVar23 = uVar17 + 0xf;
            if (-1 < (int)uVar17) {
              uVar23 = uVar17;
            }
            switch(uVar17 - (uVar23 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 0xc) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 1:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 3:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 5:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 6:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 7:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 8:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 9:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 10:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xb:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x1e) * 2);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xc:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              puVar19 = puVar19 + 1;
              break;
            case 0xd:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xe:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xf:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
            }
            iVar8 = (int)puVar15;
            uVar16 = iVar8 - 4;
            lVar21 = lVar21 + 4;
            uVar17 = uVar17 + 4;
            pvVar24 = (void *)(ulong)uVar17;
            puVar15 = (uint *)(ulong)uVar16;
          } while (7 < iVar8);
        }
        if (0xfffffffc < uVar16 - 4) {
          lVar22 = 0;
          uVar10 = uVar10 & 0xff;
          do {
            uVar20 = uVar17 + (int)lVar22;
            uVar23 = uVar17 + 0xf + (int)lVar22;
            if (-1 < (int)uVar20) {
              uVar23 = uVar20;
            }
            iVar8 = uVar20 - (uVar23 & 0xfffffff0);
            uVar23 = (uint)bVar4;
            if ((BitMaskArray[iVar8] & *puVar19) != 0) {
              uVar23 = uVar10;
            }
            *(byte *)(lVar21 + lVar22) = *(byte *)(lVar21 + lVar22) | (byte)uVar23;
            puVar19 = puVar19 + (iVar8 == 0xf);
            lVar22 = lVar22 + 1;
          } while (uVar16 != (uint)lVar22);
        }
      }
      else {
        if (ERASE_atom != uStack_1f8) {
          uVar17 = error("lineBlt8:Illegal operation specified");
          return uVar17;
        }
        uVar23 = uVar17 + 0xf;
        if (-1 < (int)uVar17) {
          uVar23 = uVar17;
        }
        puVar19 = (ushort *)((long)psVar18->__unused + (long)((int)uVar23 >> 4) * 2 + -0x78);
        lVar21 = extraout_RDX_00;
        if (3 < (int)uVar16) {
          do {
            uVar17 = (uint)pvVar24;
            uVar23 = uVar17 + 0xf;
            if (-1 < (int)uVar17) {
              uVar23 = uVar17;
            }
            switch(uVar17 - (uVar23 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 0xc) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 1:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 3:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar19 + 1);
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(bVar1 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 5:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 6:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 7:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 8:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 9:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 10:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x3c));
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xb:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0x1e) * 2);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xc:
              uVar2 = *puVar19;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar22 + (ulong)(uVar2 & 0xf) * 4);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              puVar19 = puVar19 + 1;
              break;
            case 0xd:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xe:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
              break;
            case 0xf:
              uVar2 = *puVar19;
              uVar3 = puVar19[1];
              puVar19 = puVar19 + 1;
              lVar22 = 0;
              do {
                *(byte *)(lVar21 + lVar22) =
                     *(byte *)(lVar21 + lVar22) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar22);
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 != 4);
            }
            iVar8 = (int)puVar15;
            uVar16 = iVar8 - 4;
            lVar21 = lVar21 + 4;
            uVar17 = uVar17 + 4;
            pvVar24 = (void *)(ulong)uVar17;
            puVar15 = (uint *)(ulong)uVar16;
          } while (7 < iVar8);
        }
        if (uVar16 - 1 < 3) {
          lVar22 = 0;
          uVar10 = (uint)(uVar25 & 0xff);
          do {
            uVar20 = uVar17 + (int)lVar22;
            uVar23 = uVar17 + 0xf + (int)lVar22;
            if (-1 < (int)uVar20) {
              uVar23 = uVar20;
            }
            iVar8 = uVar20 - (uVar23 & 0xfffffff0);
            uVar14 = (ulong)bVar4;
            if ((BitMaskArray[iVar8] & *puVar19) != 0) {
              uVar14 = uVar25 & 0xff;
            }
            *(byte *)(lVar21 + lVar22) = *(byte *)(lVar21 + lVar22) & ~(byte)uVar14;
            puVar19 = puVar19 + (iVar8 == 0xf);
            lVar22 = lVar22 + 1;
          } while (uVar16 != (uint)lVar22);
        }
      }
      return uVar10;
    }
    in_R8 = 0xffffffff;
    in_R9 = 0;
    Storage_expanded = iVar9;
    pDVar13 = (DLword *)mmap((void *)0x0,(ulong)(uVar17 << 0x14),3,0x22,-1,0);
    if (pDVar13 == (DLword *)0xffffffffffffffff) goto LAB_00129ed3;
    Lisp_world = pDVar13;
    iVar9 = fstat(iVar8,&local_138);
    if (iVar9 != -1) {
      uVar25 = local_138.st_size + 0x1ff;
      if (-1 < local_138.st_size) {
        uVar25 = local_138.st_size;
      }
      uVar14 = (ulong)local_1cc;
      if (local_1cc == 0x15e3) {
        if ((local_138.st_size & 0x1ffU) != 0) {
          printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n");
        }
        uVar14 = (ulong)local_144;
        local_200 = local_144;
        uVar23 = (uint)(uVar25 >> 9);
        if (local_144 != (uVar23 & 0x7fffffff)) {
          printf("sysout_loader:IFPAGE says sysout size is %d\n",uVar14);
          printf("But, sysout size from UNIX is %d\n",(ulong)(uVar23 & 0x7fffffff));
          exit(-1);
        }
        pvVar24 = (void *)((ulong)local_174 * 0x200 + -0x1fc);
        _Var11 = lseek(iVar8,(__off_t)pvVar24,0);
        if (_Var11 == -1) {
          sysout_loader_cold_5();
        }
        else {
          __buf = malloc((ulong)(uVar23 * 4 + 4));
          pvVar24 = __buf;
          sVar12 = read(iVar8,__buf,(ulong)(uVar23 << 2));
          if (sVar12 != -1) {
            word_swap_page(__buf,local_144 + 1);
            init_display2(Lisp_world + 0x120000,0x200000);
            if (uVar14 != 0) {
              unaff_R15 = (char *)0xffffffffffffffff;
              uVar25 = 0;
              do {
                uVar23 = *(uint *)((long)__buf + uVar25 * 4);
                if (uVar23 < 0xffff0000) {
                  __offset = (char *)(ulong)(uint)((int)uVar25 << 9);
                  if (unaff_R15 == __offset) {
LAB_00129e14:
                    pvVar24 = (void *)((long)pDVar13 + (ulong)(uVar23 << 9));
                    sVar12 = read(iVar8,pvVar24,0x200);
                    if (sVar12 != -1) {
                      unaff_R15 = unaff_R15 + 0x200;
                      word_swap_page(pvVar24,0x80);
                      goto LAB_00129e4c;
                    }
                    sysout_loader_cold_3();
                  }
                  else {
                    _Var11 = lseek(iVar8,(__off_t)__offset,0);
                    if (_Var11 != -1) {
                      uVar23 = *(uint *)((long)__buf + uVar25 * 4);
                      unaff_R15 = __offset;
                      goto LAB_00129e14;
                    }
                  }
                  sysout_loader_cold_2();
                  goto LAB_00129e9b;
                }
LAB_00129e4c:
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar14);
            }
            free(__buf);
            flush_display_buffer();
            close(iVar8);
            return uVar17;
          }
        }
        sysout_loader_cold_4();
        goto LAB_00129f39;
      }
      goto LAB_00129edf;
    }
  }
  sysout_loader_cold_6();
  uVar14 = extraout_RDX;
LAB_00129edf:
  printf("sysout_loader: %s isn\'t a sysout:\nkey is %x, should be %x\n",sysout_file_name,uVar14,
         0x15e3);
  exit(1);
}

Assistant:

unsigned sysout_loader(const char *sysout_file_name, unsigned sys_size) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

#ifdef BIGVM
  /* 1 "cell" per page for 256MB in 512 byte pages */
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif                /* BIGVM */
  off_t fptovp_offset; /* FPTOVP start offset */

  char *lispworld_scratch; /* scratch area for lispworld */
  size_t lispworld_offset;   /* lispworld offset */

  unsigned sysout_size; /* sysout size in page */
  struct stat stat_buf; /* file stat buf */

  char errmsg[255];
  off_t cfp = -1;  /* tracks current file position in sysout, or -1 */

  /* Checks for specifying the process size (phase I) */
  /* If sys_size == 0 figure out the proper size later */
  if ((sys_size != 0) && (sys_size < DEFAULT_PRIME_SYSOUTSIZE)) {
    perror("You have to specify more than 8MB for process size");
    exit(-1);
  } else if (sys_size > MAX_EXPLICIT_SYSOUTSIZE) {
    perror("256Mb is the maximum legal sysout size.");
    exit(-1);
  }

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }

  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

/* Check the sysout and emulator for compatibility:
       The sysout's ifpage.lversion must be >= LVERSION, and
       the sysout's ifpage.minbversion must be <= MINBVERSION
*/
#ifndef NOVERSION
  if (ifpage.lversion < LVERSION) {
    (void)fprintf(stderr, "Lisp VM is too old for this emulator.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", ifpage.lversion, LVERSION);
    exit(-1);
  }

  if (ifpage.minbversion > MINBVERSION) {
    (void)fprintf(stderr, "Emulator is too old for this Lisp VM.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", MINBVERSION, ifpage.minbversion);
    exit(-1);
  }
#endif /* NOVERSION */

  /* use default or the previous one */
  if (sys_size == 0) {
    if (ifpage.process_size == 0)        /* Pure LISP.SYSOUT */
      sys_size = DEFAULT_MAX_SYSOUTSIZE; /* default for pure SYSOUT */
    else
      sys_size = ifpage.process_size; /* use previous one */
  }

  /* Checks for specifying the process size (phase II) */
  if ((ifpage.storagefullstate == SFS_ARRAYSWITCHED) ||
      (ifpage.storagefullstate == SFS_FULLYSWITCHED)) {
    /* Storage may be allocated from Secondary space */
    /* Therefore you can not change \\DefaultSecondMDSPage */
    if (ifpage.process_size != sys_size) {
      char tmp[200];
      sprintf(tmp,
              "\nsysout loader: Error, secondary space in use. You can't specify size.\nProcess "
              "size = %d\nSys size = %d\n",
              ifpage.process_size, sys_size);
#ifdef DOS
      /* Note that we have an initialized display by now. */
      /* Hence we have to observe the display protocol. */
      VESA_errorexit(tmp);
#else
      (void)fprintf(stderr, "sysout_loader: You can't specify the process size.\n");
      (void)fprintf(stderr, "Because, secondary space is already used.\n");
      (void)fprintf(stderr, "(size is %d, you specified %d.)\n", ifpage.process_size, sys_size);
      exit(-1);
#endif /* DOS */
    }
    /*Can use this sys_size as the process size */
    /* The sys_size should be same as the previous one */
    Storage_expanded = NIL;
  } else { /* assumes that we can expand the process space */
    Storage_expanded = T;
    /* You can use secondary space , though it was STORAGEFULL
       So, STORAGEFULL may be set to NIL later  */
  }

  /* allocate Virtual Memory Space */

  lispworld_scratch = mmap(0, sys_size * MBYTE, PROT_READ|PROT_WRITE, MAP_ANON | MAP_PRIVATE, -1, 0);
  if (lispworld_scratch == MAP_FAILED) {
    (void)fprintf(stderr, "sysout_loader: can't allocate Lisp %dMBytes VM \n", sys_size);
    exit(-1);
  }

  /* now you can access lispworld */
  Lisp_world = (DLword *)lispworld_scratch;

  DBPRINT(("VM allocated = 0x%x at %p\n", sys_size * MBYTE, (void *)Lisp_world));
  DBPRINT(("Native Load Address = 0x%x\n", native_load_address));

  /*
   * get FPTOVP location and SysoutFile size
   */

  /* get FPTOVP location from IFPAGE */
  fptovp_offset = ifpage.fptovpstart;

  DBPRINT(("FPTOVP Location %ld \n", (long)fptovp_offset));

  /* get sysout file size in halfpage(256) */
  if (fstat(sysout, &stat_buf) == -1) {
    perror("sysout_loader: can't get sysout file size");
    exit(-1);
  }
  sysout_size = (unsigned)(stat_buf.st_size / BYTESPER_PAGE * 2);

  DBPRINT(("sysout size / 2 = 0x%x\n", sysout_size / 2));
  DBPRINT(("vmem size = 0x%x\n", ifpage.nactivepages));

  /* do some simple checks to see if this is really a sysout */
  if (ifpage.key != IFPAGE_KEYVAL) {
    printf("sysout_loader: %s isn't a sysout:\nkey is %x, should be %x\n", sysout_file_name,
           ifpage.key, IFPAGE_KEYVAL);
    exit(1);
  }

  if ((stat_buf.st_size & (BYTESPER_PAGE - 1)) != 0)
    printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n",
           (int)(stat_buf.st_size & (BYTESPER_PAGE - 1)));

  if (ifpage.nactivepages != (sysout_size / 2)) {
    printf("sysout_loader:IFPAGE says sysout size is %d\n", ifpage.nactivepages);
    printf("But, sysout size from UNIX is %d\n", sysout_size / 2);
    exit(-1);
  }

/*
 * Now get FPTOVP
 */

/* seek to FPTOVP */
#ifdef BIGVM
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 4;
#else
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 2;
#endif
  if (lseek(sysout, fptovp_offset, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to FPTOVP");
    exit(-1);
  }

  /* read FPTOVP */

#ifdef BIGVM
  /* fptovp is now in cells, not words */
  fptovp = malloc(sysout_size * 2 + 4);
  if (read(sysout, fptovp, sysout_size * 2) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  /* So space to swap is twice as big, too. */
  word_swap_page((unsigned short *)fptovp, (sysout_size / 2) + 1);
#endif /* BYTESWAP */

#else

  fptovp = malloc(sysout_size + 2);
  if (read(sysout, fptovp, sysout_size) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)fptovp, (sysout_size / 4) + 1);
#endif /* BYTESWAP */

#endif /* BIGVM */

  /*
   * Initialize the display (note now passing 68k address!!!)
   */
  init_display2(NativeAligned2FromLAddr(DISPLAY_OFFSET), 65536 * 16 * 2);

  /* read sysout file to lispworld */

  for (unsigned i = 0; i < (sysout_size / 2); i++) {
#ifdef DOS
    /* Dial that floats from left to right on the top line of the */
    /* displaty. Dial shows % of sysout loaded by digits and */
    /* position. */
    int columns;
    switch (currentdsp->graphicsmode) {
      case 0x104:
        columns = 120; /* 131 - 10 */
        break;
      case 0x102:
        columns = 69; /* 79 - 10 */
        break;
      default:
        columns = 69; /* 79 - 10 */
        break;
    }
    _settextposition((short)0, (short)0);
    if ((i & 0xf) == 0) {
      for (int j = 0; j < (columns * i) / (sysout_size >> 1); j++) putchar(' ');
      printf("-=(%2d%%)=-\n", (100 * i) / (sysout_size >> 1));
    }
#endif /* DOS */
    if (GETPAGEOK(fptovp, i) != 0177777) {
      /* only seek if not already at desired position */
      if (i * BYTESPER_PAGE != cfp) {
	if (lseek(sysout, i * BYTESPER_PAGE, SEEK_SET) == -1) {
	  perror("sysout_loader: can't seek sysout file");
	  free(fptovp);
	  exit(-1);
	}
	cfp = i * BYTESPER_PAGE; /* now at known position */
      }
      lispworld_offset = GETFPTOVP(fptovp, i) * BYTESPER_PAGE;
      if (read(sysout, lispworld_scratch + lispworld_offset, BYTESPER_PAGE) == -1) {
        printf("sysout_loader: can't read sysout file at %d\n", i);
        printf("               offset was 0x%zx (0x%x pages).\n", lispworld_offset,
               GETFPTOVP(fptovp, i));
        perror("read() error was");
        for (int j = 0; j < 10; j++) {
          printf(" %d: 0x%x  ", j, GETFPTOVP(fptovp, j));
        }
        free(fptovp);
        exit(-1);
      }
      cfp += BYTESPER_PAGE; /* new known position */
#ifdef BYTESWAP
      word_swap_page((DLword *)(lispworld_scratch + lispworld_offset), 128);
#endif
    }
  }
  free(fptovp);
  DBPRINT(("sysout file is read completely.\n"));

#if (defined(DISPLAYBUFFER) || defined(XWINDOW) || defined(DOS))
  TPRINT(("Flushing display buffer...\n"));
  flush_display_buffer();
  TPRINT(("After Flushing display buffer\n"));
#endif /* DISPLAYBUFFER || XWINDOW || DOS */

  close(sysout);
  return (sys_size);
}